

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Thermo::getCurrentDensity
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Thermo *this)

{
  double *pdVar1;
  _Rb_tree_header *p_Var2;
  Snapshot *pSVar3;
  RigidBody *this_00;
  Atom *pAVar4;
  AtomType *pAVar5;
  bool bVar6;
  uint i;
  Molecule *pMVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  ulong uVar11;
  uint i_1;
  pointer pVVar12;
  uint uVar13;
  long lVar14;
  pointer ppRVar15;
  ulong uVar16;
  int iVar17;
  pointer ppAVar18;
  double dVar19;
  RealType RVar20;
  FixedChargeAdapter fca;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> typeJc;
  MoleculeIterator miter;
  Vector<double,_3U> result;
  FluctuatingChargeAdapter fqa;
  AtomTypeSet simTypes;
  FixedChargeAdapter local_f0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_e8;
  MoleculeIterator local_d0;
  double local_c8 [4];
  value_type local_a8;
  Snapshot *local_90;
  Thermo *local_88;
  FluctuatingChargeAdapter local_80;
  double local_78 [3];
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_60;
  
  pSVar3 = this->info_->sman_->currentSnapshot_;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)&local_60,this->info_);
  local_d0._M_node = (_Base_ptr)0x0;
  local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            (&local_e8,local_60._M_impl.super__Rb_tree_header._M_node_count,
             (value_type *)OpenMD::V3Zero,(allocator_type *)local_78);
  local_90 = pSVar3;
  local_88 = this;
  pMVar7 = SimInfo::beginMolecule(this->info_,&local_d0);
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  do {
    if (pMVar7 == (Molecule *)0x0) {
      MPI_Allreduce(1,&local_a8,3,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        uVar11 = 0;
        uVar16 = 1;
        do {
          MPI_Allreduce(1,local_e8.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar11,3,&ompi_mpi_double,
                        &ompi_mpi_op_sum,&ompi_mpi_comm_world);
          bVar6 = uVar16 < local_60._M_impl.super__Rb_tree_header._M_node_count;
          uVar11 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar6);
      }
      RVar20 = Snapshot::getVolume(local_90);
      lVar10 = 0;
      do {
        local_a8.super_Vector<double,_3U>.data_[lVar10] =
             local_a8.super_Vector<double,_3U>.data_[lVar10] / (RVar20 * 6.241573027317e-17);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        uVar13 = 0;
        pVVar12 = local_e8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          lVar10 = 0;
          do {
            (pVVar12->super_Vector<double,_3U>).data_[lVar10] =
                 (pVVar12->super_Vector<double,_3U>).data_[lVar10] / (RVar20 * 6.241573027317e-17);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          uVar13 = uVar13 + 1;
          pVVar12 = pVVar12 + 1;
        } while (uVar13 < local_60._M_impl.super__Rb_tree_header._M_node_count);
      }
      (__return_storage_ptr__->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (__return_storage_ptr__,&local_a8);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        uVar11 = 0;
        uVar16 = 1;
        do {
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                    (__return_storage_ptr__,
                     local_e8.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11);
          bVar6 = uVar16 < local_60._M_impl.super__Rb_tree_header._M_node_count;
          uVar11 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar6);
      }
      if (local_e8.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
      ::~_Rb_tree(&local_60);
      return __return_storage_ptr__;
    }
    ppRVar15 = (pMVar7->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar15 !=
        (pMVar7->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00 = *ppRVar15;
      while (this_00 != (RigidBody *)0x0) {
        ppRVar15 = ppRVar15 + 1;
        RigidBody::updateAtomVel(this_00);
        if (ppRVar15 ==
            (pMVar7->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        this_00 = *ppRVar15;
      }
    }
    for (ppAVar18 = (pMVar7->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        (ppAVar18 !=
         (pMVar7->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
         _M_impl.super__Vector_impl_data._M_finish && (pAVar4 = *ppAVar18, pAVar4 != (Atom *)0x0));
        ppAVar18 = ppAVar18 + 1) {
      lVar14 = (long)(pAVar4->super_StuntDouble).localIndex_;
      lVar10 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (pAVar4->super_StuntDouble).storage_);
      local_78[2] = *(double *)(lVar10 + 0x10 + lVar14 * 0x18);
      pdVar1 = (double *)(lVar10 + lVar14 * 0x18);
      local_78[0] = *pdVar1;
      local_78[1] = pdVar1[1];
      pAVar5 = pAVar4->atomType_;
      local_f0.at_ = pAVar5;
      bVar6 = FixedChargeAdapter::isFixedCharge(&local_f0);
      dVar19 = 0.0;
      if (bVar6) {
        dVar19 = FixedChargeAdapter::getCharge(&local_f0);
      }
      local_80.at_ = pAVar5;
      bVar6 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_80);
      p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar6) {
        dVar19 = dVar19 + *(double *)
                           (*(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->
                                              currentSnapshot_->atomData).flucQPos.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                     (pAVar4->super_StuntDouble).storage_) +
                           (long)(pAVar4->super_StuntDouble).localIndex_ * 8);
      }
      for (; (_Rb_tree_header *)p_Var8 != p_Var2;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        if (*(AtomType **)(p_Var8 + 1) == pAVar5) {
          if ((_Rb_tree_header *)p_Var8 != p_Var2) {
            iVar17 = 0;
            if (p_Var9 == p_Var8) goto LAB_0013f476;
            do {
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              iVar17 = iVar17 + 1;
            } while (p_Var9 != p_Var8);
            if (iVar17 != -1) {
LAB_0013f476:
              local_c8[0] = 0.0;
              local_c8[1] = 0.0;
              local_c8[2] = 0.0;
              lVar10 = 0;
              do {
                local_c8[lVar10] = local_78[lVar10] * dVar19;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              lVar10 = 0;
              do {
                local_e8.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].super_Vector<double,_3U>.data_
                [lVar10] = local_c8[lVar10] +
                           local_e8.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].
                           super_Vector<double,_3U>.data_[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
            }
          }
          break;
        }
      }
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar10 = 0;
      do {
        local_c8[lVar10] = local_78[lVar10] * dVar19;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar10 = 0;
      do {
        local_a8.super_Vector<double,_3U>.data_[lVar10] =
             local_c8[lVar10] + local_a8.super_Vector<double,_3U>.data_[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
    }
    pMVar7 = SimInfo::nextMolecule(local_88->info_,&local_d0);
  } while( true );
}

Assistant:

std::vector<Vector3d> Thermo::getCurrentDensity() {
    Snapshot* snap       = info_->getSnapshotManager()->getCurrentSnapshot();
    AtomTypeSet simTypes = info_->getSimulatedAtomTypes();

    SimInfo::MoleculeIterator miter;
    std::vector<Atom*>::iterator iiter;
    std::vector<RigidBody*>::iterator ri;
    Molecule* mol;
    RigidBody* rb;
    Atom* atom;
    AtomType* atype;
    AtomTypeSet::iterator at;
    Vector3d Jc(0.0);
    std::vector<Vector3d> typeJc(simTypes.size(), V3Zero);

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      // change the velocities of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        rb->updateAtomVel();
      }

      for (atom = mol->beginAtom(iiter); atom != NULL;
           atom = mol->nextAtom(iiter)) {
        Vector3d v = atom->getVel();
        RealType q = 0.0;
        int typeIndex(-1);

        atype                  = atom->getAtomType();
        FixedChargeAdapter fca = FixedChargeAdapter(atype);
        if (fca.isFixedCharge()) q = fca.getCharge();
        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
        if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

        typeIndex = -1;
        at        = std::find(simTypes.begin(), simTypes.end(), atype);
        if (at != simTypes.end()) {
          typeIndex = std::distance(simTypes.begin(), at);
        }

        if (typeIndex != -1) { typeJc[typeIndex] += q * v; }
        Jc += q * v;
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Jc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      MPI_Allreduce(MPI_IN_PLACE, &typeJc[j][0], 3, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    RealType vol = snap->getVolume();

    Jc /= (vol * Constants::currentDensityConvert);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      typeJc[j] /= (vol * Constants::currentDensityConvert);
    }

    std::vector<Vector3d> result;
    result.clear();

    result.push_back(Jc);
    for (unsigned int j = 0; j < simTypes.size(); j++)
      result.push_back(typeJc[j]);

    return result;
  }